

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

int __thiscall TinyProcessLib::Process::kill(Process *this,__pid_t __pid,int __sig)

{
  int extraout_EAX;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  bool force_local;
  Process *this_local;
  
  lock._M_device._7_1_ = (byte)__pid & 1;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->close_mutex);
  if ((0 < (this->data).id) && ((this->closed & 1U) == 0)) {
    if ((lock._M_device._7_1_ & 1) == 0) {
      ::kill(-(this->data).id,2);
    }
    else {
      ::kill(-(this->data).id,0xf);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_EAX;
}

Assistant:

void Process::kill(bool force) noexcept {
  std::lock_guard<std::mutex> lock(close_mutex);
  if(data.id > 0 && !closed) {
    if(force)
      ::kill(-data.id, SIGTERM);
    else
      ::kill(-data.id, SIGINT);
  }
}